

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_mem(lua_State *L)

{
  TValue *pTVar1;
  GCstr *pGVar2;
  lua_State *in_RDI;
  TValue *base;
  
  if (in_RDI->status == '\x06') {
    lj_vm_unwind_c(in_RDI->cframe,4);
  }
  pTVar1 = (TValue *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 400);
  if (pTVar1 != (TValue *)0x0) {
    in_RDI->base = pTVar1;
  }
  if (*(char *)((ulong)in_RDI->base[-1].u32.lo + 6) == '\0') {
    in_RDI->top = in_RDI->base +
                  (int)(uint)*(byte *)((ulong)*(uint *)((ulong)in_RDI->base[-1].u32.lo + 0x10) -
                                      0x39);
  }
  pTVar1 = in_RDI->top;
  in_RDI->top = pTVar1 + 1;
  pGVar2 = lj_err_str(in_RDI,LJ_ERR_ERRMEM);
  ((GCRef *)&(pTVar1->u32).lo)->gcptr32 = (uint32_t)pGVar2;
  (pTVar1->field_2).it = 0xfffffffb;
  lj_err_throw((lua_State *)&pTVar1->field_2,(int)((ulong)in_RDI >> 0x20));
}

Assistant:

LJ_NOINLINE void lj_err_mem(lua_State *L)
{
  if (L->status == LUA_ERRERR+1)  /* Don't touch the stack during lua_open. */
    lj_vm_unwind_c(L->cframe, LUA_ERRMEM);
  if (LJ_HASJIT) {
    TValue *base = tvref(G(L)->jit_base);
    if (base) L->base = base;
  }
  if (curr_funcisL(L)) L->top = curr_topL(L);
  setstrV(L, L->top++, lj_err_str(L, LJ_ERR_ERRMEM));
  lj_err_throw(L, LUA_ERRMEM);
}